

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

buffer_info * __thiscall
pybind11::buffer::request(buffer_info *__return_storage_ptr__,buffer *this,bool writable)

{
  int iVar1;
  Py_buffer *view;
  error_already_set *this_00;
  undefined7 in_register_00000011;
  
  view = (Py_buffer *)operator_new(0x50);
  view->buf = (void *)0x0;
  view->obj = (PyObject *)0x0;
  view->len = 0;
  view->itemsize = 0;
  view->readonly = 0;
  view->ndim = 0;
  view->format = (char *)0x0;
  view->shape = (Py_ssize_t *)0x0;
  view->strides = (Py_ssize_t *)0x0;
  view->suboffsets = (Py_ssize_t *)0x0;
  view->internal = (void *)0x0;
  iVar1 = PyObject_GetBuffer((this->super_object).super_handle.m_ptr,view,
                             (uint)CONCAT71(in_register_00000011,writable) | 0x1c);
  if (iVar1 == 0) {
    buffer_info::buffer_info(__return_storage_ptr__,view,true);
    return __return_storage_ptr__;
  }
  operator_delete(view,0x50);
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

buffer_info request(bool writable = false) const {
        int flags = PyBUF_STRIDES | PyBUF_FORMAT;
        if (writable) flags |= PyBUF_WRITABLE;
        auto *view = new Py_buffer();
        if (PyObject_GetBuffer(m_ptr, view, flags) != 0) {
            delete view;
            throw error_already_set();
        }
        return buffer_info(view);
    }